

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.c
# Opt level: O0

float incircleexact(float *pa,float *pb,float *pc,float *pd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float _0;
  float _j;
  float _i;
  float err3;
  float err2;
  float err1;
  float blo;
  float bhi;
  float alo;
  float ahi;
  float abig;
  float c;
  float around;
  float bround;
  float avirt;
  float bvirt;
  int i;
  int deterlen;
  float deter [384];
  int cdlen;
  int ablen;
  float cddet [192];
  float abdet [192];
  int dlen;
  int clen;
  int blen;
  int alen;
  float ddet [96];
  float cdet [96];
  float bdet [96];
  float adet [96];
  int ylen;
  int xlen;
  float det48y [48];
  float det48x [48];
  float det24y [24];
  float det24x [24];
  int dablen;
  int cdalen;
  int bcdlen;
  int abclen;
  float dab [12];
  float cda [12];
  float bcd [12];
  float abc [12];
  float local_108;
  int templen;
  float temp8 [8];
  float bd [4];
  float ac [4];
  float da [4];
  float cd [4];
  float bc [4];
  float ab [4];
  float dxby0;
  float cxay0;
  float axdy0;
  float dxcy0;
  float cxby0;
  float bxay0;
  float bxdy0;
  float axcy0;
  float dxay0;
  float cxdy0;
  float bxcy0;
  float axby0;
  float dxby1;
  float cxay1;
  float axdy1;
  float dxcy1;
  float cxby1;
  float bxay1;
  float bxdy1;
  float axcy1;
  float dxay1;
  float cxdy1;
  float bxcy1;
  float axby1;
  float *pd_local;
  float *pc_local;
  float *pb_local;
  float *pa_local;
  
  fVar6 = *pa * pb[1];
  fVar7 = splitter * *pa - (splitter * *pa - *pa);
  fVar8 = splitter * pb[1] - (splitter * pb[1] - pb[1]);
  fVar7 = (*pa - fVar7) * (pb[1] - fVar8) +
          -(-fVar7 * (pb[1] - fVar8) + -(*pa - fVar7) * fVar8 + -fVar7 * fVar8 + fVar6);
  fVar8 = *pb * pa[1];
  fVar9 = splitter * *pb - (splitter * *pb - *pb);
  fVar10 = splitter * pa[1] - (splitter * pa[1] - pa[1]);
  fVar9 = (*pb - fVar9) * (pa[1] - fVar10) +
          -(-fVar9 * (pa[1] - fVar10) + -(*pb - fVar9) * fVar10 + -fVar9 * fVar10 + fVar8);
  fVar10 = fVar7 - fVar9;
  bc[2] = (fVar7 - (fVar10 + (fVar7 - fVar10))) + ((fVar7 - fVar10) - fVar9);
  fVar7 = (fVar6 + fVar10) - fVar6;
  fVar6 = (fVar6 - ((fVar6 + fVar10) - fVar7)) + (fVar10 - fVar7);
  fVar7 = fVar6 - (fVar6 - fVar8);
  bc[3] = (fVar6 - ((fVar6 - fVar8) + fVar7)) + (fVar7 - fVar8);
  fVar6 = *pb * pc[1];
  fVar7 = splitter * *pb - (splitter * *pb - *pb);
  fVar8 = splitter * pc[1] - (splitter * pc[1] - pc[1]);
  fVar7 = (*pb - fVar7) * (pc[1] - fVar8) +
          -(-fVar7 * (pc[1] - fVar8) + -(*pb - fVar7) * fVar8 + -fVar7 * fVar8 + fVar6);
  fVar8 = *pc * pb[1];
  fVar9 = splitter * *pc - (splitter * *pc - *pc);
  fVar10 = splitter * pb[1] - (splitter * pb[1] - pb[1]);
  fVar9 = (*pc - fVar9) * (pb[1] - fVar10) +
          -(-fVar9 * (pb[1] - fVar10) + -(*pc - fVar9) * fVar10 + -fVar9 * fVar10 + fVar8);
  fVar10 = fVar7 - fVar9;
  cd[2] = (fVar7 - (fVar10 + (fVar7 - fVar10))) + ((fVar7 - fVar10) - fVar9);
  fVar7 = fVar6 + fVar10;
  fVar6 = (fVar6 - (fVar7 - (fVar7 - fVar6))) + (fVar10 - (fVar7 - fVar6));
  fVar9 = fVar6 - fVar8;
  cd[3] = (fVar6 - (fVar9 + (fVar6 - fVar9))) + ((fVar6 - fVar9) - fVar8);
  bc[1] = fVar7 + fVar9;
  bc[0] = (fVar7 - (bc[1] - (bc[1] - fVar7))) + (fVar9 - (bc[1] - fVar7));
  fVar6 = *pc * pd[1];
  fVar7 = splitter * *pc - (splitter * *pc - *pc);
  fVar8 = splitter * pd[1] - (splitter * pd[1] - pd[1]);
  fVar7 = (*pc - fVar7) * (pd[1] - fVar8) +
          -(-fVar7 * (pd[1] - fVar8) + -(*pc - fVar7) * fVar8 + -fVar7 * fVar8 + fVar6);
  fVar8 = *pd * pc[1];
  fVar9 = splitter * *pd - (splitter * *pd - *pd);
  fVar10 = splitter * pc[1] - (splitter * pc[1] - pc[1]);
  fVar9 = (*pd - fVar9) * (pc[1] - fVar10) +
          -(-fVar9 * (pc[1] - fVar10) + -(*pd - fVar9) * fVar10 + -fVar9 * fVar10 + fVar8);
  fVar10 = fVar7 - fVar9;
  da[2] = (fVar7 - (fVar10 + (fVar7 - fVar10))) + ((fVar7 - fVar10) - fVar9);
  fVar7 = fVar6 + fVar10;
  fVar6 = (fVar6 - (fVar7 - (fVar7 - fVar6))) + (fVar10 - (fVar7 - fVar6));
  fVar9 = fVar6 - fVar8;
  da[3] = (fVar6 - (fVar9 + (fVar6 - fVar9))) + ((fVar6 - fVar9) - fVar8);
  cd[1] = fVar7 + fVar9;
  cd[0] = (fVar7 - (cd[1] - (cd[1] - fVar7))) + (fVar9 - (cd[1] - fVar7));
  fVar6 = *pd * pa[1];
  fVar7 = splitter * *pd - (splitter * *pd - *pd);
  fVar8 = splitter * pa[1] - (splitter * pa[1] - pa[1]);
  fVar7 = (*pd - fVar7) * (pa[1] - fVar8) +
          -(-fVar7 * (pa[1] - fVar8) + -(*pd - fVar7) * fVar8 + -fVar7 * fVar8 + fVar6);
  fVar8 = *pa * pd[1];
  fVar9 = splitter * *pa - (splitter * *pa - *pa);
  fVar10 = splitter * pd[1] - (splitter * pd[1] - pd[1]);
  fVar9 = (*pa - fVar9) * (pd[1] - fVar10) +
          -(-fVar9 * (pd[1] - fVar10) + -(*pa - fVar9) * fVar10 + -fVar9 * fVar10 + fVar8);
  fVar10 = fVar7 - fVar9;
  ac[2] = (fVar7 - (fVar10 + (fVar7 - fVar10))) + ((fVar7 - fVar10) - fVar9);
  fVar7 = fVar6 + fVar10;
  fVar6 = (fVar6 - (fVar7 - (fVar7 - fVar6))) + (fVar10 - (fVar7 - fVar6));
  fVar9 = fVar6 - fVar8;
  ac[3] = (fVar6 - (fVar9 + (fVar6 - fVar9))) + ((fVar6 - fVar9) - fVar8);
  da[1] = fVar7 + fVar9;
  da[0] = (fVar7 - (da[1] - (da[1] - fVar7))) + (fVar9 - (da[1] - fVar7));
  fVar6 = *pa * pc[1];
  fVar7 = splitter * *pa - (splitter * *pa - *pa);
  fVar8 = splitter * pc[1] - (splitter * pc[1] - pc[1]);
  fVar7 = (*pa - fVar7) * (pc[1] - fVar8) +
          -(-fVar7 * (pc[1] - fVar8) + -(*pa - fVar7) * fVar8 + -fVar7 * fVar8 + fVar6);
  fVar8 = *pc * pa[1];
  fVar9 = splitter * *pc - (splitter * *pc - *pc);
  fVar10 = splitter * pa[1] - (splitter * pa[1] - pa[1]);
  fVar9 = (*pc - fVar9) * (pa[1] - fVar10) +
          -(-fVar9 * (pa[1] - fVar10) + -(*pc - fVar9) * fVar10 + -fVar9 * fVar10 + fVar8);
  fVar10 = fVar7 - fVar9;
  bd[2] = (fVar7 - (fVar10 + (fVar7 - fVar10))) + ((fVar7 - fVar10) - fVar9);
  fVar7 = fVar6 + fVar10;
  fVar6 = (fVar6 - (fVar7 - (fVar7 - fVar6))) + (fVar10 - (fVar7 - fVar6));
  fVar9 = fVar6 - fVar8;
  bd[3] = (fVar6 - (fVar9 + (fVar6 - fVar9))) + ((fVar6 - fVar9) - fVar8);
  ac[1] = fVar7 + fVar9;
  ac[0] = (fVar7 - (ac[1] - (ac[1] - fVar7))) + (fVar9 - (ac[1] - fVar7));
  fVar6 = *pb * pd[1];
  fVar7 = splitter * *pb - (splitter * *pb - *pb);
  fVar8 = splitter * pd[1] - (splitter * pd[1] - pd[1]);
  fVar7 = (*pb - fVar7) * (pd[1] - fVar8) +
          -(-fVar7 * (pd[1] - fVar8) + -(*pb - fVar7) * fVar8 + -fVar7 * fVar8 + fVar6);
  fVar8 = *pd * pb[1];
  fVar9 = splitter * *pd - (splitter * *pd - *pd);
  fVar10 = splitter * pb[1] - (splitter * pb[1] - pb[1]);
  fVar9 = (*pd - fVar9) * (pb[1] - fVar10) +
          -(-fVar9 * (pb[1] - fVar10) + -(*pd - fVar9) * fVar10 + -fVar9 * fVar10 + fVar8);
  fVar10 = fVar7 - fVar9;
  temp8[6] = (fVar7 - (fVar10 + (fVar7 - fVar10))) + ((fVar7 - fVar10) - fVar9);
  fVar7 = fVar6 + fVar10;
  fVar6 = (fVar6 - (fVar7 - (fVar7 - fVar6))) + (fVar10 - (fVar7 - fVar6));
  fVar9 = fVar6 - fVar8;
  temp8[7] = (fVar6 - (fVar9 + (fVar6 - fVar9))) + ((fVar6 - fVar9) - fVar8);
  bd[1] = fVar7 + fVar9;
  bd[0] = (fVar7 - (bd[1] - (bd[1] - fVar7))) + (fVar9 - (bd[1] - fVar7));
  iVar1 = fast_expansion_sum_zeroelim(4,da + 2,4,ac + 2,&local_108);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,&local_108,4,bd + 2,dab + 10);
  iVar2 = fast_expansion_sum_zeroelim(4,ac + 2,4,bc + 2,&local_108);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,&local_108,4,temp8 + 6,(float *)&bcdlen);
  for (avirt = 0.0; (int)avirt < 4; avirt = (float)((int)avirt + 1)) {
    temp8[(long)(int)avirt + 6] = -temp8[(long)(int)avirt + 6];
    bd[(long)(int)avirt + 2] = -bd[(long)(int)avirt + 2];
  }
  iVar3 = fast_expansion_sum_zeroelim(4,bc + 2,4,cd + 2,&local_108);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,&local_108,4,bd + 2,bcd + 10);
  iVar4 = fast_expansion_sum_zeroelim(4,cd + 2,4,da + 2,&local_108);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,&local_108,4,temp8 + 6,cda + 10);
  iVar5 = scale_expansion_zeroelim(iVar4,cda + 10,SUB84((double)*pa,0),det24y + 0x16);
  iVar5 = scale_expansion_zeroelim(iVar5,det24y + 0x16,SUB84((double)*pa,0),det48y + 0x2e);
  iVar4 = scale_expansion_zeroelim(iVar4,cda + 10,SUB84((double)pa[1],0),det48x + 0x2e);
  iVar4 = scale_expansion_zeroelim(iVar4,det48x + 0x2e,SUB84((double)pa[1],0),(float *)&ylen);
  iVar4 = fast_expansion_sum_zeroelim(iVar5,det48y + 0x2e,iVar4,(float *)&ylen,bdet + 0x5e);
  iVar5 = scale_expansion_zeroelim(iVar1,dab + 10,SUB84((double)*pb,0),det24y + 0x16);
  iVar5 = scale_expansion_zeroelim(iVar5,det24y + 0x16,SUB84((double)-*pb,0),det48y + 0x2e);
  iVar1 = scale_expansion_zeroelim(iVar1,dab + 10,SUB84((double)pb[1],0),det48x + 0x2e);
  iVar1 = scale_expansion_zeroelim(iVar1,det48x + 0x2e,SUB84((double)-pb[1],0),(float *)&ylen);
  iVar1 = fast_expansion_sum_zeroelim(iVar5,det48y + 0x2e,iVar1,(float *)&ylen,cdet + 0x5e);
  iVar5 = scale_expansion_zeroelim(iVar2,(float *)&bcdlen,SUB84((double)*pc,0),det24y + 0x16);
  iVar5 = scale_expansion_zeroelim(iVar5,det24y + 0x16,SUB84((double)*pc,0),det48y + 0x2e);
  iVar2 = scale_expansion_zeroelim(iVar2,(float *)&bcdlen,SUB84((double)pc[1],0),det48x + 0x2e);
  iVar2 = scale_expansion_zeroelim(iVar2,det48x + 0x2e,SUB84((double)pc[1],0),(float *)&ylen);
  iVar2 = fast_expansion_sum_zeroelim(iVar5,det48y + 0x2e,iVar2,(float *)&ylen,ddet + 0x5e);
  iVar5 = scale_expansion_zeroelim(iVar3,bcd + 10,SUB84((double)*pd,0),det24y + 0x16);
  iVar5 = scale_expansion_zeroelim(iVar5,det24y + 0x16,SUB84((double)-*pd,0),det48y + 0x2e);
  iVar3 = scale_expansion_zeroelim(iVar3,bcd + 10,SUB84((double)pd[1],0),det48x + 0x2e);
  iVar3 = scale_expansion_zeroelim(iVar3,det48x + 0x2e,SUB84((double)-pd[1],0),(float *)&ylen);
  iVar3 = fast_expansion_sum_zeroelim(iVar5,det48y + 0x2e,iVar3,(float *)&ylen,(float *)&blen);
  iVar1 = fast_expansion_sum_zeroelim(iVar4,bdet + 0x5e,iVar1,cdet + 0x5e,cddet + 0xbe);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,ddet + 0x5e,iVar3,(float *)&blen,(float *)&cdlen);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,cddet + 0xbe,iVar2,(float *)&cdlen,(float *)&i);
  return (float)(&i)[iVar1 + -1];
}

Assistant:

REAL incircleexact(pa, pb, pc, pd)
REAL *pa;
REAL *pb;
REAL *pc;
REAL *pd;
{
  INEXACT REAL axby1, bxcy1, cxdy1, dxay1, axcy1, bxdy1;
  INEXACT REAL bxay1, cxby1, dxcy1, axdy1, cxay1, dxby1;
  REAL axby0, bxcy0, cxdy0, dxay0, axcy0, bxdy0;
  REAL bxay0, cxby0, dxcy0, axdy0, cxay0, dxby0;
  REAL ab[4], bc[4], cd[4], da[4], ac[4], bd[4];
  REAL temp8[8];
  int templen;
  REAL abc[12], bcd[12], cda[12], dab[12];
  int abclen, bcdlen, cdalen, dablen;
  REAL det24x[24], det24y[24], det48x[48], det48y[48];
  int xlen, ylen;
  REAL adet[96], bdet[96], cdet[96], ddet[96];
  int alen, blen, clen, dlen;
  REAL abdet[192], cddet[192];
  int ablen, cdlen;
  REAL deter[384];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;

  Two_Product(pa[0], pb[1], axby1, axby0);
  Two_Product(pb[0], pa[1], bxay1, bxay0);
  Two_Two_Diff(axby1, axby0, bxay1, bxay0, ab[3], ab[2], ab[1], ab[0]);

  Two_Product(pb[0], pc[1], bxcy1, bxcy0);
  Two_Product(pc[0], pb[1], cxby1, cxby0);
  Two_Two_Diff(bxcy1, bxcy0, cxby1, cxby0, bc[3], bc[2], bc[1], bc[0]);

  Two_Product(pc[0], pd[1], cxdy1, cxdy0);
  Two_Product(pd[0], pc[1], dxcy1, dxcy0);
  Two_Two_Diff(cxdy1, cxdy0, dxcy1, dxcy0, cd[3], cd[2], cd[1], cd[0]);

  Two_Product(pd[0], pa[1], dxay1, dxay0);
  Two_Product(pa[0], pd[1], axdy1, axdy0);
  Two_Two_Diff(dxay1, dxay0, axdy1, axdy0, da[3], da[2], da[1], da[0]);

  Two_Product(pa[0], pc[1], axcy1, axcy0);
  Two_Product(pc[0], pa[1], cxay1, cxay0);
  Two_Two_Diff(axcy1, axcy0, cxay1, cxay0, ac[3], ac[2], ac[1], ac[0]);

  Two_Product(pb[0], pd[1], bxdy1, bxdy0);
  Two_Product(pd[0], pb[1], dxby1, dxby0);
  Two_Two_Diff(bxdy1, bxdy0, dxby1, dxby0, bd[3], bd[2], bd[1], bd[0]);

  templen = fast_expansion_sum_zeroelim(4, cd, 4, da, temp8);
  cdalen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, cda);
  templen = fast_expansion_sum_zeroelim(4, da, 4, ab, temp8);
  dablen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, dab);
  for (i = 0; i < 4; i++) {
    bd[i] = -bd[i];
    ac[i] = -ac[i];
  }
  templen = fast_expansion_sum_zeroelim(4, ab, 4, bc, temp8);
  abclen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, abc);
  templen = fast_expansion_sum_zeroelim(4, bc, 4, cd, temp8);
  bcdlen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, bcd);

  xlen = scale_expansion_zeroelim(bcdlen, bcd, pa[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, pa[0], det48x);
  ylen = scale_expansion_zeroelim(bcdlen, bcd, pa[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, pa[1], det48y);
  alen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, adet);

  xlen = scale_expansion_zeroelim(cdalen, cda, pb[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, -pb[0], det48x);
  ylen = scale_expansion_zeroelim(cdalen, cda, pb[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, -pb[1], det48y);
  blen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, bdet);

  xlen = scale_expansion_zeroelim(dablen, dab, pc[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, pc[0], det48x);
  ylen = scale_expansion_zeroelim(dablen, dab, pc[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, pc[1], det48y);
  clen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, cdet);

  xlen = scale_expansion_zeroelim(abclen, abc, pd[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, -pd[0], det48x);
  ylen = scale_expansion_zeroelim(abclen, abc, pd[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, -pd[1], det48y);
  dlen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, deter);

  return deter[deterlen - 1];
}